

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  bool bVar1;
  iterator iVar2;
  fstream_t *pfVar3;
  key_type local_14;
  
  if (fs == (fstream_t *)0x0) {
    bVar1 = base::TypedConfigurations::toFile(this->m_typedConfigurations,level);
    if (!bVar1) {
      return;
    }
    pfVar3 = base::TypedConfigurations::fileStream(this->m_typedConfigurations,level);
    if (pfVar3 == (fstream_t *)0x0) {
      return;
    }
  }
  std::ostream::flush();
  iVar2 = base::utils::std::
          _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_unflushedCount)._M_h,&local_14);
  if (iVar2.super__Node_iterator_base<std::pair<const_el::Level,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    *(undefined4 *)
     ((long)iVar2.super__Node_iterator_base<std::pair<const_el::Level,_unsigned_int>,_true>._M_cur +
     0xc) = 0;
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::unordered_map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}